

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

stbi_uc * stbi_load_gif_from_memory
                    (stbi_uc *buffer,int len,int **delays,int *x,int *y,int *z,int *comp,
                    int req_comp)

{
  int iVar1;
  int iVar2;
  stbi__context *__src;
  uchar *puVar3;
  int *piVar4;
  undefined8 *puVar5;
  uchar *data;
  long lVar6;
  long lVar7;
  int iVar8;
  size_t __size;
  int *two_back;
  int iVar9;
  size_t local_8998;
  stbi__context s;
  stbi__gif local_88a0;
  
  s.io.read = (_func_int_void_ptr_char_ptr_int *)0x0;
  s.read_from_callbacks = 0;
  s.callback_already_read = 0;
  s.img_buffer_end = buffer + len;
  two_back = y;
  s.img_buffer = buffer;
  s.img_buffer_original = buffer;
  s.img_buffer_original_end = s.img_buffer_end;
  iVar2 = stbi__gif_test(&s);
  if (iVar2 == 0) {
    puVar5 = (undefined8 *)__tls_get_addr(&PTR_001f0f18);
    *puVar5 = "Image was not as a gif type.";
    data = (uchar *)0x0;
  }
  else {
    memset(&local_88a0,0,0x8870);
    if (delays != (int **)0x0) {
      *delays = (int *)0x0;
    }
    local_8998 = 4;
    lVar7 = 0;
    lVar6 = 0;
    data = (uchar *)0x0;
    while( true ) {
      __src = (stbi__context *)
              stbi__gif_load_next(&s,&local_88a0,comp,(int)lVar6,(stbi_uc *)two_back);
      iVar2 = (int)lVar7;
      if ((__src == &s) || (__src == (stbi__context *)0x0)) break;
      *x = local_88a0.w;
      *y = local_88a0.h;
      iVar8 = local_88a0.h * local_88a0.w;
      iVar1 = iVar8 * 4;
      __size = (size_t)((iVar2 + 1) * iVar1);
      if (data == (uchar *)0x0) {
        puVar3 = (uchar *)malloc(__size);
        if (puVar3 != (uchar *)0x0) {
          if (delays != (int **)0x0) {
            piVar4 = (int *)malloc(local_8998);
            *delays = piVar4;
            data = puVar3;
            if (piVar4 == (int *)0x0) goto LAB_001b8925;
          }
          goto LAB_001b8833;
        }
        stbi__load_gif_main_outofmem(&local_88a0,(stbi_uc *)0x0,delays);
LAB_001b8946:
        data = (uchar *)0x0;
        goto LAB_001b894b;
      }
      puVar3 = (uchar *)realloc(data,__size);
      if (puVar3 == (uchar *)0x0) {
LAB_001b8925:
        stbi__load_gif_main_outofmem(&local_88a0,data,delays);
        goto LAB_001b8946;
      }
      if (delays != (int **)0x0) {
        piVar4 = (int *)realloc(*delays,local_8998);
        data = puVar3;
        if (piVar4 == (int *)0x0) goto LAB_001b8925;
        *delays = piVar4;
      }
LAB_001b8833:
      memcpy(puVar3 + iVar2 * iVar1,__src,(long)iVar1);
      if (lVar7 != 0) {
        lVar6 = (long)puVar3 - (long)(iVar8 * 8);
      }
      if (delays != (int **)0x0) {
        (*delays)[lVar7] = local_88a0.delay;
      }
      local_8998 = local_8998 + 4;
      lVar7 = lVar7 + 1;
      data = puVar3;
    }
    free(local_88a0.out);
    free(local_88a0.history);
    free(local_88a0.background);
    if ((req_comp & 0xfffffffbU) != 0) {
      data = stbi__convert_format(data,4,req_comp,local_88a0.w * iVar2,local_88a0.h);
    }
    *z = iVar2;
  }
LAB_001b894b:
  lVar6 = __tls_get_addr(&PTR_001f0f18);
  iVar2 = stbi__vertically_flip_on_load_global;
  if (*(int *)(lVar6 + 0xc) != 0) {
    iVar2 = *(int *)(lVar6 + 8);
  }
  if (iVar2 != 0) {
    iVar2 = *x;
    iVar1 = *y;
    iVar8 = *comp;
    puVar3 = data;
    iVar9 = 0;
    if (0 < *z) {
      iVar9 = *z;
    }
    while (iVar9 != 0) {
      stbi__vertical_flip(puVar3,iVar2,iVar1,iVar8);
      puVar3 = puVar3 + iVar1 * iVar2 * iVar8;
      iVar9 = iVar9 + -1;
    }
  }
  return data;
}

Assistant:

STBIDEF stbi_uc *stbi_load_gif_from_memory(stbi_uc const *buffer, int len, int **delays, int *x, int *y, int *z, int *comp, int req_comp)
{
   unsigned char *result;
   stbi__context s;
   stbi__start_mem(&s,buffer,len);

   result = (unsigned char*) stbi__load_gif_main(&s, delays, x, y, z, comp, req_comp);
   if (stbi__vertically_flip_on_load) {
      stbi__vertical_flip_slices( result, *x, *y, *z, *comp );
   }

   return result;
}